

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauNpn2.c
# Opt level: O3

int Dtt_PrintStats(int nNodes,int nVars,Vec_Wec_t *vFunNodes,word nSteps,abctime clk,int fDelay,
                  word nMultis)

{
  int iVar1;
  long lVar2;
  undefined8 uVar3;
  int iVar4;
  uint uVar5;
  timespec local_40;
  
  if ((-1 < nNodes) && (nNodes < vFunNodes->nSize)) {
    iVar1 = vFunNodes->pArray[(uint)nNodes].nSize;
    uVar3 = 0x44;
    if (fDelay == 0) {
      uVar3 = 0x4e;
    }
    iVar4 = 0;
    printf("%c =%2d  |  ",uVar3,(ulong)(uint)nNodes);
    printf("C =%12.0f  |  ",(double)(long)nSteps);
    printf("New%d =%10d   ",nVars,(ulong)(iVar1 + (uint)(nNodes == 0)));
    if ((long)vFunNodes->nSize < 1) {
      uVar5 = 1;
    }
    else {
      lVar2 = 0;
      do {
        iVar4 = iVar4 + *(int *)((long)&vFunNodes->pArray->nSize + lVar2);
        lVar2 = lVar2 + 0x10;
      } while ((long)vFunNodes->nSize * 0x10 != lVar2);
      uVar5 = iVar4 + 1;
    }
    printf("All%d =%10d  |  ",nVars,(ulong)uVar5);
    printf("Multi =%10d  |  ",nMultis);
    iVar4 = 3;
    iVar1 = clock_gettime(3,&local_40);
    if (iVar1 < 0) {
      lVar2 = -1;
    }
    else {
      lVar2 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
    }
    Abc_Print(iVar4,"%s =","Time");
    Abc_Print(iVar4,"%9.2f sec\n",(double)(lVar2 - clk) / 1000000.0);
    fflush(_stdout);
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWec.h"
                ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
}

Assistant:

int Dtt_PrintStats( int nNodes, int nVars, Vec_Wec_t * vFunNodes, word nSteps, abctime clk, int fDelay, word nMultis )
{
    int nNew = Vec_IntSize(Vec_WecEntry(vFunNodes, nNodes));
    printf("%c =%2d  |  ",     fDelay ? 'D':'N', nNodes );
    printf("C =%12.0f  |  ",   (double)(iword)nSteps );
    printf("New%d =%10d   ",   nVars, nNew + (int)(nNodes==0) );
    printf("All%d =%10d  |  ", nVars, Vec_WecSizeSize(vFunNodes)+1 );
    printf("Multi =%10d  |  ", (int)nMultis );
    Abc_PrintTime( 1, "Time",  Abc_Clock() - clk );
    //Abc_Print(1, "%9.2f sec\n", 1.0*(Abc_Clock() - clk)/(CLOCKS_PER_SEC));
    fflush(stdout);
    return nNew;
}